

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

bool __thiscall Liby::http::ReplyParser::ParseHeader(ReplyParser *this,char *begin,char *end)

{
  int iVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  string key;
  string value;
  key_type local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (((end != (char *)0x0) && (begin != (char *)0x0)) && (begin <= end)) {
    local_70._M_dataplus._M_p._0_1_ = 0x3a;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>(begin,end);
    if (pcVar2 == (char *)0x0) {
      this->progress_ = 10;
    }
    else {
      pcVar6 = pcVar2 + 1;
      do {
        iVar1 = isspace((int)pcVar6[-2]);
        pcVar6 = pcVar6 + -1;
        pcVar4 = pcVar2;
      } while (iVar1 != 0);
      do {
        pcVar5 = pcVar4 + 1;
        iVar1 = isspace((int)pcVar4[1]);
        pcVar4 = pcVar5;
      } while (iVar1 != 0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,begin,pcVar6);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,end);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(this->super_Reply).headers_,&local_70);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    return pcVar2 != (char *)0x0;
  }
  __assert_fail("begin <= end && begin && end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpDef.cpp"
                ,0x1be,"bool Liby::http::ReplyParser::ParseHeader(const char *, const char *)");
}

Assistant:

bool ReplyParser::ParseHeader(const char *begin, const char *end) {
    assert(begin <= end && begin && end);

    const char *mid = std::find(begin, end, ':');
    if (mid == nullptr) {
        progress_ = InvalidHeader;
        return false;
    }

    const char *left = mid - 1;
    const char *right = mid + 1;
    while (std::isspace(*left))
        left--;
    while (std::isspace(*right))
        right++;
    std::string key(begin, left + 1);
    std::string value(right, end);
    headers_[key] = value;
    return true;
}